

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<duckdb::ColumnIndex>
          (Serializer *this,vector<duckdb::ColumnIndex,_true> *vec)

{
  pointer pCVar1;
  ColumnIndex *item;
  pointer value;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->
                        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(vec->
                        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5);
  pCVar1 = (vec->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (value = (vec->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
               super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl
               .super__Vector_impl_data._M_start; value != pCVar1; value = value + 1) {
    WriteValue<duckdb::ColumnIndex>(this,value);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}